

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_agree_crypt(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *crypt,
                   size_t crypt_len)

{
  char *pcVar1;
  uchar *puVar2;
  LIBSSH2_CRYPT_METHOD *pLVar3;
  size_t needle_len;
  bool bVar4;
  uchar *local_70;
  size_t local_68;
  LIBSSH2_CRYPT_METHOD *method;
  size_t method_len;
  uchar *p;
  uchar *s;
  LIBSSH2_CRYPT_METHOD **cryptp;
  size_t crypt_len_local;
  uchar *crypt_local;
  libssh2_endpoint_data *endpoint_local;
  LIBSSH2_SESSION *session_local;
  
  s = (uchar *)libssh2_crypt_methods();
  if (endpoint->crypt_prefs == (char *)0x0) {
    while( true ) {
      bVar4 = false;
      if (*(long *)s != 0) {
        bVar4 = **(long **)s != 0;
      }
      if (!bVar4) {
        return -1;
      }
      puVar2 = (uchar *)**(undefined8 **)s;
      needle_len = strlen((char *)**(undefined8 **)s);
      puVar2 = _libssh2_kex_agree_instr(crypt,crypt_len,puVar2,needle_len);
      if (puVar2 != (uchar *)0x0) break;
      s = s + 8;
    }
    endpoint->crypt = *(LIBSSH2_CRYPT_METHOD **)s;
    session_local._4_4_ = 0;
  }
  else {
    p = (uchar *)endpoint->crypt_prefs;
    while( true ) {
      bVar4 = false;
      if (p != (uchar *)0x0) {
        bVar4 = *p != '\0';
      }
      if (!bVar4) {
        return -1;
      }
      pcVar1 = strchr((char *)p,0x2c);
      if (pcVar1 == (char *)0x0) {
        local_68 = strlen((char *)p);
      }
      else {
        local_68 = (long)pcVar1 - (long)p;
      }
      puVar2 = _libssh2_kex_agree_instr(crypt,crypt_len,p,local_68);
      if (puVar2 != (uchar *)0x0) break;
      if (pcVar1 == (char *)0x0) {
        local_70 = (uchar *)0x0;
      }
      else {
        local_70 = (uchar *)(pcVar1 + 1);
      }
      p = local_70;
    }
    pLVar3 = (LIBSSH2_CRYPT_METHOD *)
             kex_get_method_by_name((char *)p,local_68,(LIBSSH2_COMMON_METHOD **)s);
    if (pLVar3 == (LIBSSH2_CRYPT_METHOD *)0x0) {
      session_local._4_4_ = -1;
    }
    else {
      endpoint->crypt = pLVar3;
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int kex_agree_crypt(LIBSSH2_SESSION * session,
                           libssh2_endpoint_data *endpoint,
                           unsigned char *crypt,
                           size_t crypt_len)
{
    const LIBSSH2_CRYPT_METHOD **cryptp = libssh2_crypt_methods();
    unsigned char *s;

    (void)session;

    if(endpoint->crypt_prefs) {
        s = (unsigned char *) endpoint->crypt_prefs;

        while(s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if(_libssh2_kex_agree_instr(crypt, crypt_len, s, method_len)) {
                const LIBSSH2_CRYPT_METHOD *method =
                    (const LIBSSH2_CRYPT_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           cryptp);

                if(!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->crypt = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while(*cryptp && (*cryptp)->name) {
        s = _libssh2_kex_agree_instr(crypt, crypt_len,
                                     (unsigned char *) (*cryptp)->name,
                                     strlen((*cryptp)->name));
        if(s) {
            endpoint->crypt = *cryptp;
            return 0;
        }
        cryptp++;
    }

    return -1;
}